

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

void __thiscall AsyncTCPClient::onRequestComplete(AsyncTCPClient *this,shared_ptr<Session> *session)

{
  uint uVar1;
  Callback p_Var2;
  bool bVar3;
  int iVar4;
  element_type *peVar5;
  undefined1 local_90 [8];
  error_code ec;
  _Self local_70 [3];
  uint local_54;
  _Self local_50;
  iterator it;
  unique_lock<std::mutex> lock;
  undefined1 local_28 [8];
  error_code ignored_ec;
  shared_ptr<Session> *session_local;
  AsyncTCPClient *this_local;
  
  ignored_ec.cat_ = (error_category *)session;
  boost::system::error_code::error_code((error_code *)local_28);
  peVar5 = std::__shared_ptr_access<Session,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Session,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      session);
  boost::asio::
  basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::shutdown((basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
              *)peVar5,2,(int)(error_code *)local_28);
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)&it,&this->m_active_sessions_guard);
  peVar5 = std::__shared_ptr_access<Session,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Session,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      session);
  local_54 = peVar5->m_id;
  local_50._M_node =
       (_Base_ptr)
       std::
       map<int,_std::shared_ptr<Session>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Session>_>_>_>
       ::find(&this->m_active_sessions,(key_type *)&local_54);
  local_70[0]._M_node =
       (_Base_ptr)
       std::
       map<int,_std::shared_ptr<Session>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Session>_>_>_>
       ::end(&this->m_active_sessions);
  bVar3 = std::operator!=(&local_50,local_70);
  if (bVar3) {
    ec.cat_ = (error_category *)
              std::
              map<int,std::shared_ptr<Session>,std::less<int>,std::allocator<std::pair<int_const,std::shared_ptr<Session>>>>
              ::erase_abi_cxx11_((map<int,std::shared_ptr<Session>,std::less<int>,std::allocator<std::pair<int_const,std::shared_ptr<Session>>>>
                                  *)&this->m_active_sessions,(iterator)local_50._M_node);
  }
  std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)&it);
  boost::system::error_code::error_code((error_code *)local_90);
  peVar5 = std::__shared_ptr_access<Session,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Session,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      session);
  iVar4 = boost::system::error_code::value(&peVar5->m_ec);
  if ((iVar4 == 0) &&
     (peVar5 = std::__shared_ptr_access<Session,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Session,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          session), (peVar5->m_was_cancelled & 1U) != 0)) {
    boost::system::error_code::operator=((error_code *)local_90,operation_aborted);
  }
  else {
    peVar5 = std::__shared_ptr_access<Session,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Session,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        session);
    local_90._0_4_ = (peVar5->m_ec).val_;
    local_90[4] = (peVar5->m_ec).failed_;
    local_90._5_3_ = *(undefined3 *)&(peVar5->m_ec).field_0x5;
    ec._0_8_ = (peVar5->m_ec).cat_;
  }
  peVar5 = std::__shared_ptr_access<Session,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Session,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      session);
  p_Var2 = peVar5->m_callback;
  peVar5 = std::__shared_ptr_access<Session,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Session,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      session);
  uVar1 = peVar5->m_id;
  peVar5 = std::__shared_ptr_access<Session,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Session,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      session);
  (*p_Var2)(uVar1,&peVar5->m_response,(error_code *)local_90);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&it);
  return;
}

Assistant:

void onRequestComplete(std::shared_ptr<Session> session)
    {
        // Shutting down the connection. This method may
        // fail in case socket is not connected. We don�t care
        // about the error code if this function fails.
        boost::system::error_code ignored_ec;

        session->m_sock.shutdown( asio::ip::tcp::socket::shutdown_both, ignored_ec);

        // Remove session form the map of active sessions.
        std::unique_lock<std::mutex>
            lock(m_active_sessions_guard);

        auto it = m_active_sessions.find(session->m_id);
        if (it != m_active_sessions.end())
            m_active_sessions.erase(it);

        lock.unlock();

        boost::system::error_code ec;

        if (session->m_ec.value() == 0 && session->m_was_cancelled)
            ec = asio::error::operation_aborted;
        else
            ec = session->m_ec;

        // Call the callback provided by the user.
        session->m_callback(session->m_id,
                            session->m_response, ec);
    }